

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TaprootScriptTree_Branch_Test::TestBody(TaprootScriptTree_Branch_Test *this)

{
  pointer pBVar1;
  pointer pBVar2;
  ScriptBuilder *this_00;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  ulong uVar5;
  initializer_list<cfd::core::ByteData256> __l;
  uint8_t leaf_version;
  bool is_parity;
  AssertionResult gtest_ar_11;
  SchnorrSignature sig;
  string local_338;
  AssertHelper local_318;
  AssertionResult gtest_ar_3;
  Privkey sk;
  TaprootScriptTree tree2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  string exp_tree_str;
  TaprootScriptTree tree;
  SchnorrPubkey schnorr_pubkey;
  string tree_str;
  Privkey key;
  ByteData256 msg;
  Script script;
  SchnorrPubkey pk;
  Pubkey pubkey;
  
  std::__cxx11::string::string
            ((string *)&tree,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&tree2);
  cfd::core::Privkey::Privkey(&key,(string *)&tree,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tree,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&tree2,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x44c698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree);
  std::__cxx11::string::~string((string *)&tree);
  if ((char)tree2.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&tree);
    if (tree2.super_TapBranch._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)tree2.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree2.super_TapBranch.has_leaf_);
  tree2.super_TapBranch._vptr_TapBranch._0_1_ = is_parity;
  tree2.super_TapBranch.has_leaf_ = false;
  tree2.super_TapBranch.leaf_version_ = '\0';
  tree2.super_TapBranch._10_6_ = 0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tree,(internal *)&tree2,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x59,(char *)tree.super_TapBranch._vptr_TapBranch);
    testing::internal::AssertHelper::operator=((AssertHelper *)&script,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script);
    std::__cxx11::string::~string((string *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree2.super_TapBranch.has_leaf_);
  tree.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_005ba258;
  tree.super_TapBranch.has_leaf_ = false;
  tree.super_TapBranch.leaf_version_ = '\0';
  tree.super_TapBranch._10_6_ = 0;
  tree.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this_00 = cfd::core::ScriptBuilder::operator<<
                      ((ScriptBuilder *)&tree,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build(&script,this_00);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree);
  leaf_version = 0xc4;
  std::__cxx11::string::string
            ((string *)&tree2,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&sig);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&tree,(string *)&tree2);
  std::__cxx11::string::string
            ((string *)&gtest_ar_3,
             "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",(allocator *)&sk);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree.super_TapBranch.script_.script_data_,(string *)&gtest_ar_3);
  __l._M_len = 2;
  __l._M_array = (iterator)&tree;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&tree_str);
  lVar3 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&tree.super_TapBranch._vptr_TapBranch + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&tree2);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,leaf_version,&script);
  cfd::core::TapBranch::TapBranch
            (&tree2.super_TapBranch,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start);
  cfd::core::TaprootScriptTree::AddBranch(&tree,&tree2.super_TapBranch);
  cfd::core::TapBranch::~TapBranch(&tree2.super_TapBranch);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)&tree2,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::core::TapBranch::AddBranch(&tree.super_TapBranch,(SchnorrPubkey *)&tree2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree2);
  gtest_ar_3.success_ = (bool)cfd::core::TapBranch::GetLeafVersion(&tree.super_TapBranch);
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&tree2,"leaf_version","tree.GetLeafVersion()",&leaf_version,
             &gtest_ar_3.success_);
  if ((char)tree2.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (tree2.super_TapBranch._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)tree2.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree2.super_TapBranch.has_leaf_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_3,&script);
  cfd::core::TapBranch::GetScript((Script *)&tree2,&tree.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&sig,(Script *)&tree2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&sk,"script.GetHex()","tree.GetScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  cfd::core::Script::~Script((Script *)&tree2);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if ((char)sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tree2);
    if (sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x66,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)nodes.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&tree2,&tree
            );
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((tree2.super_TapBranch._8_8_ -
                 CONCAT71(tree2.super_TapBranch._vptr_TapBranch._1_7_,
                          (char)tree2.super_TapBranch._vptr_TapBranch)) / 0x18);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_3,"nodes.size()","tree.GetNodeList().size()",
             (unsigned_long *)&sig,(unsigned_long *)&sk);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&tree2);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&tree2);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x67,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  pBVar2 = nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar1 = nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&tree2,&tree
            );
  lVar3 = tree2.super_TapBranch._8_8_ -
          CONCAT71(tree2.super_TapBranch._vptr_TapBranch._1_7_,
                   (char)tree2.super_TapBranch._vptr_TapBranch);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&tree2);
  if ((long)pBVar2 - (long)pBVar1 == lVar3) {
    lVar3 = 0;
    uVar5 = 0;
    while( true ) {
      if ((ulong)(((long)nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar5) break;
      cfd::core::ByteData256::GetHex_abi_cxx11_
                ((string *)&tree2,
                 (ByteData256 *)
                 ((long)&((nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3));
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig,
                 &tree);
      cfd::core::ByteData256::GetHex_abi_cxx11_
                ((string *)&gtest_ar_3,
                 (ByteData256 *)
                 (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar3));
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&sk,"nodes[index].GetHex()","tree.GetNodeList()[index].GetHex()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree2,
                 (string *)&gtest_ar_3);
      std::__cxx11::string::~string((string *)&gtest_ar_3);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig);
      std::__cxx11::string::~string((string *)&tree2);
      if ((char)sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == '\0') {
        testing::Message::Message((Message *)&tree2);
        pcVar4 = "";
        if (sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish != (pointer)0x0) {
          pcVar4 = *(char **)sk.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x6a,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&tree2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sk.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x18;
    }
  }
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&gtest_ar_3,&tree);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&tree2,(ByteData256 *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig,"\"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae\""
             ,"tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree2);
  std::__cxx11::string::~string((string *)&tree2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if ((char)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tree2);
    if (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&gtest_ar_3,&tree.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&tree2,(ByteData256 *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig,"\"daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4\""
             ,"tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree2);
  std::__cxx11::string::~string((string *)&tree2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if ((char)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tree2);
    if (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&gtest_ar_3,&tree.super_TapBranch,&schnorr_pubkey,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tree2,(SchnorrPubkey *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig,"\"cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a\""
             ,"tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",
             (char (*) [65])"cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree2);
  std::__cxx11::string::~string((string *)&tree2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if ((char)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tree2);
    if (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::TapBranch::GetTweakedPrivkey
            ((Privkey *)&gtest_ar_3,&tree.super_TapBranch,&key,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&tree2,(Privkey *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig,"\"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab\""
             ,"tree.GetTweakedPrivkey(key).GetHex()",
             (char (*) [65])"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree2);
  std::__cxx11::string::~string((string *)&tree2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if ((char)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tree2);
    if (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x74,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree2,&tree);
  cfd::core::TapBranch::GetTweakedPrivkey((Privkey *)&sig,&tree2.super_TapBranch,&key,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&gtest_ar_3,(Privkey *)&sig);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sk,"\"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab\"",
             "tree2.GetTweakedPrivkey(key).GetHex()",
             (char (*) [65])"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  if ((char)sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&gtest_ar_3,
             "e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02",(allocator *)&sig);
  cfd::core::ByteData256::ByteData256(&msg,(string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  cfd::core::TapBranch::GetTweakedPubkey(&pk,&tree.super_TapBranch,&schnorr_pubkey,(bool *)0x0);
  cfd::core::TapBranch::GetTweakedPrivkey(&sk,&tree.super_TapBranch,&key,(bool *)0x0);
  cfd::core::SchnorrUtil::Sign(&sig,&msg,&sk);
  tree_str._M_dataplus._M_p._0_1_ = cfd::core::SchnorrPubkey::Verify(&pk,&sig,&msg);
  tree_str._M_string_length = 0;
  if (!(bool)tree_str._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&exp_tree_str);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3,(internal *)&tree_str,(AssertionResult *)"pk.Verify(sig, msg)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x7e,(char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&exp_tree_str);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_tree_str);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree_str._M_string_length);
  cfd::core::TapBranch::ToString_abi_cxx11_(&tree_str,&tree.super_TapBranch);
  std::__cxx11::string::string
            ((string *)&exp_tree_str,
             "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(51,c4)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}"
             ,(allocator *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_3,"exp_tree_str","tree_str",&exp_tree_str,&tree_str);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_338);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_338);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::TapBranch::FromString((TapBranch *)&gtest_ar_3,&exp_tree_str);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_338,(TapBranch *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_11,"exp_tree_str","br.ToString()",&exp_tree_str,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&local_338);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_338);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  cfd::core::TapBranch::~TapBranch((TapBranch *)&gtest_ar_3);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)&gtest_ar_3,&exp_tree_str,&script,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_338);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_338);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_338,(TapBranch *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_11,"exp_tree_str","rebuild_tree.ToString()",&exp_tree_str,
             &local_338);
  std::__cxx11::string::~string((string *)&local_338);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&local_338);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_338);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&exp_tree_str);
  std::__cxx11::string::~string((string *)&tree_str);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&msg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree2);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(leaf_version, script);
  tree.AddBranch(TapBranch(nodes[0]));
  tree.AddBranch(SchnorrPubkey(nodes[1]));

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree.GetTweakedPrivkey(key).GetHex());

  TaprootScriptTree tree2(tree);
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree2.GetTweakedPrivkey(key).GetHex());

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));

  auto tree_str = tree.ToString();
  std::string exp_tree_str = "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(51,c4)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}";
  EXPECT_EQ(exp_tree_str, tree_str);

  try {
    auto br = TapBranch::FromString(exp_tree_str);
    EXPECT_EQ(exp_tree_str, br.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    auto rebuild_tree = TaprootScriptTree::FromString(exp_tree_str, script);
    EXPECT_EQ(exp_tree_str, rebuild_tree.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}